

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_module * lys_get_import_module_ns(lys_module *module,char *ns)

{
  int iVar1;
  int local_24;
  int i;
  char *ns_local;
  lys_module *module_local;
  
  if ((module != (lys_module *)0x0) && (ns != (char *)0x0)) {
    if ((module->field_0x40 & 1) == 0) {
      iVar1 = ly_strequal_(module->ns,ns);
      if (iVar1 != 0) {
        return module;
      }
    }
    else {
      iVar1 = ly_strequal_((char *)module->data[1].parent,ns);
      if (iVar1 != 0) {
        return (lys_module *)module->data;
      }
    }
    local_24 = 0;
    while( true ) {
      if ((int)(uint)module->imp_size <= local_24) {
        return (lys_module *)0x0;
      }
      iVar1 = ly_strequal_((module->imp[local_24].module)->ns,ns);
      if (iVar1 != 0) break;
      local_24 = local_24 + 1;
    }
    return module->imp[local_24].module;
  }
  __assert_fail("module && ns",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                ,0x9c6,
                "const struct lys_module *lys_get_import_module_ns(const struct lys_module *, const char *)"
               );
}

Assistant:

const struct lys_module *
lys_get_import_module_ns(const struct lys_module *module, const char *ns)
{
    int i;

    assert(module && ns);

    if (module->type) {
        /* the module is actually submodule and to get the namespace, we need the main module */
        if (ly_strequal(((struct lys_submodule *)module)->belongsto->ns, ns, 0)) {
            return ((struct lys_submodule *)module)->belongsto;
        }
    } else {
        /* modul's own namespace */
        if (ly_strequal(module->ns, ns, 0)) {
            return module;
        }
    }

    /* imported modules */
    for (i = 0; i < module->imp_size; ++i) {
        if (ly_strequal(module->imp[i].module->ns, ns, 0)) {
            return module->imp[i].module;
        }
    }

    return NULL;
}